

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

void __thiscall
Js::RecyclableArrayWalker::RecyclableArrayWalker
          (RecyclableArrayWalker *this,ScriptContext *scriptContext,Var instance,
          Var originalInstance)

{
  (this->super_RecyclableObjectWalker).scriptContext = scriptContext;
  (this->super_RecyclableObjectWalker).instance = instance;
  (this->super_RecyclableObjectWalker).originalInstance = originalInstance;
  (this->super_RecyclableObjectWalker).fakeGroupObjectWalkerList =
       (List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0;
  (this->super_RecyclableObjectWalker).pMembersList =
       (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0;
  (this->super_RecyclableObjectWalker).innerArrayObjectWalker = (RecyclableArrayWalker *)0x0;
  (this->super_RecyclableObjectWalker).super_IDiagObjectModelWalkerBase.
  _vptr_IDiagObjectModelWalkerBase = (_func_int **)&PTR_Get_0137f0d0;
  this->indexedItemCount = 0;
  this->pAbsoluteIndexList =
       (List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
       0x0;
  this->fOnlyOwnProperties = false;
  return;
}

Assistant:

RecyclableArrayWalker::RecyclableArrayWalker(ScriptContext* scriptContext, Var instance, Var originalInstance)
        : indexedItemCount(0),
          pAbsoluteIndexList(nullptr),
          fOnlyOwnProperties(false),
          RecyclableObjectWalker(scriptContext,instance,originalInstance)
    {
    }